

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_>::Data
          (Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *this,
          Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *other)

{
  Entry *pEVar1;
  uchar *puVar2;
  byte bVar3;
  Span *pSVar4;
  Entry *pEVar5;
  QSocketNotifier *pQVar6;
  QSocketNotifier *pQVar7;
  QSocketNotifier *pQVar8;
  Node<int,_QSocketNotifierSetUNIX> *pNVar9;
  long lVar10;
  size_t sVar11;
  size_t sVar12;
  long in_FS_OFFSET;
  R_conflict7 RVar13;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar11 = other->numBuckets;
  sVar12 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar12;
  this->spans = (Span *)0x0;
  RVar13 = allocateSpans(sVar11);
  this->spans = (Span *)RVar13.spans;
  lVar10 = 0;
  for (sVar11 = 0; sVar11 != RVar13.nSpans; sVar11 = sVar11 + 1) {
    pSVar4 = other->spans;
    for (sVar12 = 0; sVar12 != 0x80; sVar12 = sVar12 + 1) {
      bVar3 = pSVar4->offsets[sVar12 + lVar10];
      if (bVar3 != 0xff) {
        pEVar5 = pSVar4[sVar11].entries;
        local_48.span = this->spans + sVar11;
        local_48.index = sVar12;
        pNVar9 = Bucket::insert(&local_48);
        pEVar1 = pEVar5 + bVar3;
        pQVar6 = *(QSocketNotifier **)((pEVar1->storage).data + 8);
        puVar2 = pEVar5[bVar3].storage.data + 0x10;
        pQVar7 = *(QSocketNotifier **)puVar2;
        pQVar8 = *(QSocketNotifier **)(puVar2 + 8);
        *(undefined8 *)pNVar9 = *(undefined8 *)(pEVar1->storage).data;
        (pNVar9->value).notifiers[0] = pQVar6;
        (pNVar9->value).notifiers[1] = pQVar7;
        (pNVar9->value).notifiers[2] = pQVar8;
      }
    }
    lVar10 = lVar10 + 0x90;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }